

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

ON_UUID __thiscall
ON_3dmRenderSettings::RenderEnvironmentId
          (ON_3dmRenderSettings *this,EnvironmentUsage usage,EnvironmentPurpose purpose)

{
  bool bVar1;
  uint uVar2;
  ON_Skylight *pOVar3;
  ON_UUID OVar4;
  undefined1 local_40 [8];
  ON_UUID uuid_env;
  ON_EnvironmentsImpl *e;
  EnvironmentPurpose purpose_local;
  EnvironmentUsage usage_local;
  ON_3dmRenderSettings *this_local;
  uchar local_10 [8];
  
  ON_3dmRenderSettingsPrivate::Get(this);
  ON_REMOVE_ASAP_AssertEx
            ((uint)(this->m_private->_environments != (ON_EnvironmentsImpl *)0x0),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
             ,0x6fd,"","nullptr != m_private->_environments is false");
  uuid_env.Data4 = (uchar  [8])this->m_private->_environments;
  if (purpose == Standard) {
    if (usage != Background) {
      if (usage == Reflection) {
        OVar4 = ON_EnvironmentsImpl::ReflectionRenderEnvironmentId
                          ((ON_EnvironmentsImpl *)uuid_env.Data4);
        return OVar4;
      }
      if (usage == Skylighting) {
        OVar4 = ON_EnvironmentsImpl::SkylightingRenderEnvironmentId
                          ((ON_EnvironmentsImpl *)uuid_env.Data4);
        return OVar4;
      }
    }
    OVar4 = ON_EnvironmentsImpl::BackgroundRenderEnvironmentId
                      ((ON_EnvironmentsImpl *)uuid_env.Data4);
    return OVar4;
  }
  if (purpose != ForRendering) {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
               ,0x72e,"","false is false");
    _this_local = (ON_UUID)ZEXT816(0);
    return _this_local;
  }
  if (usage != Background) {
    if (usage == Reflection) {
      bVar1 = ON_EnvironmentsImpl::ReflectionRenderEnvironmentOverride
                        ((ON_EnvironmentsImpl *)uuid_env.Data4);
      if (!bVar1) {
        OVar4 = RenderEnvironmentId(this,Background,ForRendering);
        return OVar4;
      }
      OVar4 = ON_EnvironmentsImpl::ReflectionRenderEnvironmentId
                        ((ON_EnvironmentsImpl *)uuid_env.Data4);
      return OVar4;
    }
    if (usage == Skylighting) {
      pOVar3 = Skylight(this);
      uVar2 = (*pOVar3->_vptr_ON_Skylight[5])();
      if ((uVar2 & 1) == 0) {
        _this_local = (ON_UUID)ZEXT816(0);
        return _this_local;
      }
      bVar1 = ON_EnvironmentsImpl::SkylightingRenderEnvironmentOverride
                        ((ON_EnvironmentsImpl *)uuid_env.Data4);
      if (!bVar1) {
        OVar4 = RenderEnvironmentId(this,Background,ForRendering);
        return OVar4;
      }
      OVar4 = ON_EnvironmentsImpl::SkylightingRenderEnvironmentId
                        ((ON_EnvironmentsImpl *)uuid_env.Data4);
      return OVar4;
    }
  }
  if (this->m_background_style != 3) {
    _this_local = (ON_UUID)ZEXT816(0);
    return _this_local;
  }
  _local_40 = ON_EnvironmentsImpl::BackgroundRenderEnvironmentId
                        ((ON_EnvironmentsImpl *)uuid_env.Data4);
  bVar1 = ON_UuidIsNotNil((ON_UUID *)local_40);
  if (!bVar1) {
    local_10[0] = ON_UuidDefaultEnvironmentInstance.Data4[0];
    local_10[1] = ON_UuidDefaultEnvironmentInstance.Data4[1];
    local_10[2] = ON_UuidDefaultEnvironmentInstance.Data4[2];
    local_10[3] = ON_UuidDefaultEnvironmentInstance.Data4[3];
    local_10[4] = ON_UuidDefaultEnvironmentInstance.Data4[4];
    local_10[5] = ON_UuidDefaultEnvironmentInstance.Data4[5];
    local_10[6] = ON_UuidDefaultEnvironmentInstance.Data4[6];
    local_10[7] = ON_UuidDefaultEnvironmentInstance.Data4[7];
    this_local = (ON_3dmRenderSettings *)ON_UuidDefaultEnvironmentInstance._0_8_;
    return _this_local;
  }
  return _local_40;
}

Assistant:

ON_UUID ON_3dmRenderSettings::RenderEnvironmentId(EnvironmentUsage usage, EnvironmentPurpose purpose) const
{
  ON_3dmRenderSettingsPrivate::Get(*this);

  // The pointer is never null.
  ON_ASSERT(nullptr != m_private->_environments);

  const auto& e = *m_private->_environments;

  if (EnvironmentPurpose::Standard == purpose)
  {
    switch (usage)
    {
    default:
    case EnvironmentUsage::Background:  return e.BackgroundRenderEnvironmentId();
    case EnvironmentUsage::Reflection:  return e.ReflectionRenderEnvironmentId();
    case EnvironmentUsage::Skylighting: return e.SkylightingRenderEnvironmentId();
    }
  }
  else
  if (EnvironmentPurpose::ForRendering == purpose)
  {
    switch (usage)
    {
    default:
    case EnvironmentUsage::Background:
      {
      if (m_background_style != 3)
        return ON_nil_uuid;

      const auto uuid_env = e.BackgroundRenderEnvironmentId();
      if (ON_UuidIsNotNil(uuid_env))
        return uuid_env;

      return ON_UuidDefaultEnvironmentInstance;
      }

    case EnvironmentUsage::Reflection:
      if (e.ReflectionRenderEnvironmentOverride())
        return e.ReflectionRenderEnvironmentId();

      return RenderEnvironmentId(EnvironmentUsage::Background, purpose);

    case EnvironmentUsage::Skylighting:
      if (!Skylight().Enabled())
        return ON_nil_uuid;

      if (e.SkylightingRenderEnvironmentOverride())
        return e.SkylightingRenderEnvironmentId();

      return RenderEnvironmentId(EnvironmentUsage::Background, purpose);
    }
  }

  ON_ASSERT(false);
  return ON_nil_uuid;
}